

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O1

bool P_MoveThing(AActor *source,DVector3 *pos,bool fog)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  int iVar4;
  AActor *pAVar5;
  DVector3 old;
  DVector3 local_38;
  
  local_38.X = (source->__Pos).X;
  local_38.Y = (source->__Pos).Y;
  local_38.Z = (source->__Pos).Z;
  AActor::SetOrigin(source,pos->X,pos->Y,pos->Z,true);
  bVar3 = P_TestMobjLocation(source);
  if (bVar3) {
    if (fog) {
      P_SpawnTeleportFog(source,pos,false,true);
      P_SpawnTeleportFog(source,&local_38,true,true);
    }
    dVar1 = (source->__Pos).X;
    dVar2 = (source->__Pos).Y;
    (source->Prev).Z = (source->__Pos).Z;
    (source->Prev).X = dVar1;
    (source->Prev).Y = dVar2;
    (source->PrevAngles).Roll.Degrees = (source->Angles).Roll.Degrees;
    dVar1 = (source->Angles).Yaw.Degrees;
    (source->PrevAngles).Pitch.Degrees = (source->Angles).Pitch.Degrees;
    (source->PrevAngles).Yaw.Degrees = dVar1;
    if (source->Sector == (sector_t *)0x0) {
      iVar4 = 0;
    }
    else {
      iVar4 = source->Sector->PortalGroup;
    }
    source->PrevPortalGroup = iVar4;
    pAVar5 = (AActor *)(&DAT_017e5fc8)[(long)consoleplayer * 0x54];
    if ((pAVar5 != (AActor *)0x0) &&
       (((pAVar5->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
      (&DAT_017e5fc8)[(long)consoleplayer * 0x54] = 0;
      pAVar5 = (AActor *)0x0;
    }
    if (pAVar5 == source) {
      R_ResetViewInterpolation();
    }
  }
  else {
    AActor::SetOrigin(source,local_38.X,local_38.Y,local_38.Z,true);
  }
  return bVar3;
}

Assistant:

bool P_MoveThing(AActor *source, const DVector3 &pos, bool fog)
{
	DVector3 old = source->Pos();

	source->SetOrigin (pos, true);
	if (P_TestMobjLocation (source))
	{
		if (fog)
		{
			P_SpawnTeleportFog(source, pos, false, true);
			P_SpawnTeleportFog(source, old, true, true);
		}
		source->ClearInterpolation();
		if (source == players[consoleplayer].camera)
		{
			R_ResetViewInterpolation();
		}
		return true;
	}
	else
	{
		source->SetOrigin (old, true);
		return false;
	}
}